

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O1

int kget_int32(kstring_t *k,size_t *pos,int32_t *val_p)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  uVar4 = *pos;
  uVar2 = k->l;
  uVar6 = 1;
  bVar8 = uVar4 < uVar2;
  uVar5 = uVar4;
  if (bVar8) {
    do {
      if ((k->s[uVar4] != ' ') && (k->s[uVar4] != '\t')) {
        uVar5 = uVar4;
        if (bVar8) {
          bVar8 = k->s[uVar4] == '-';
          uVar6 = -(uint)bVar8 | 1;
          uVar5 = uVar4 + bVar8;
        }
        break;
      }
      uVar4 = uVar4 + 1;
      bVar8 = uVar4 < uVar2;
      uVar5 = uVar2;
    } while (uVar4 != uVar2);
  }
  iVar3 = -1;
  if ((uVar5 < uVar2) && ((byte)(k->s[uVar5] - 0x30U) < 10)) {
    iVar3 = 0;
    iVar7 = 0;
    uVar4 = uVar5;
    if (uVar5 < uVar2) {
      do {
        bVar1 = k->s[uVar5];
        uVar4 = uVar5;
        if (9 < (byte)(bVar1 - 0x30)) break;
        uVar5 = uVar5 + 1;
        iVar7 = (uint)bVar1 + iVar7 * 10 + -0x30;
        uVar4 = uVar2;
      } while (uVar2 != uVar5);
    }
    *pos = uVar4;
    *val_p = iVar7 * uVar6;
  }
  return iVar3;
}

Assistant:

static int kget_int32(kstring_t *k, size_t *pos, int32_t *val_p) {
    int sign = 1;
    int32_t val = 0;
    size_t p = *pos;

    while (p < k->l && (k->s[p] == ' ' || k->s[p] == '\t'))
	   p++;

    if (p < k->l && k->s[p] == '-')
	sign = -1, p++;

    if (p >= k->l || !(k->s[p] >= '0' && k->s[p] <= '9'))
	return -1;

    while (p < k->l && k->s[p] >= '0' && k->s[p] <= '9')
	val = val*10 + k->s[p++]-'0';
    
    *pos = p;
    *val_p = sign*val;

    return 0;
}